

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISConsole.cpp
# Opt level: O0

bool __thiscall EventHandler::keyPressed(EventHandler *this,KeyEvent *arg)

{
  ostream *poVar1;
  long in_RSI;
  
  poVar1 = std::operator<<((ostream *)&std::cout," KeyPressed {");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x10));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
  poVar1 = std::operator<<(poVar1,"} || Character (");
  poVar1 = std::operator<<(poVar1,(char)*(undefined4 *)(in_RSI + 0x14));
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if (*(int *)(in_RSI + 0x10) == 200) {
    std::operator<<((ostream *)&std::cout,"up key!\n");
  }
  return true;
}

Assistant:

bool keyPressed(const KeyEvent& arg)
	{
		std::cout << " KeyPressed {" << std::hex << arg.key << std::dec
				  << "} || Character (" << (char)arg.text << ")" << std::endl;

		if(arg.key == OIS::KeyCode::KC_UP)
		{
			std::cout << "up key!\n";
		}

		return true;
	}